

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
ModbusSimulationDataGenerator::SendWriteMultipleRegistersRequest
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U16 StartingAddress,U16 Quantity,
          U8 ByteCount,U16 *Values)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ulong uVar4;
  uint uVar5;
  ModbusSimulationDataGenerator *pMVar6;
  ModbusSimulationDataGenerator *this_00;
  U64 value;
  short sVar7;
  
  if (this->mSettings->mModbusMode == ModbusRTUClient) {
    CreateModbusByte(this,(ulong)DeviceID);
    uVar5 = (int)this + 0x30;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0x10);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(StartingAddress & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(StartingAddress >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(Quantity & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(Quantity >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)ByteCount);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    if (1 < ByteCount) {
      uVar4 = 0;
      do {
        CreateModbusByte(this,(ulong)(byte)Values[uVar4]);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        SimulationChannelDescriptor::Advance(uVar5);
        CreateModbusByte(this,(ulong)*(byte *)((long)Values + uVar4 * 2 + 1));
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        SimulationChannelDescriptor::Advance(uVar5);
        uVar4 = uVar4 + 1;
      } while (ByteCount >> 1 != uVar4);
    }
    uVar3 = this->crc_tab16
            [(uint)(Quantity >> 8) ^
             (ushort)(this->crc_tab16
                      [(uint)(StartingAddress >> 8) ^
                       (ushort)(this->crc_tab16[this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xef] >> 8
                               ^ this->crc_tab16
                                 [(ushort)(StartingAddress ^ this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                          this->crc_tab16
                                          [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xef]) & 0xff])
                       & 0xff] >> 8 ^
                     this->crc_tab16
                     [(ushort)(Quantity ^
                               this->crc_tab16
                               [(ushort)(StartingAddress ^ this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                        this->crc_tab16
                                        [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xef]) & 0xff] >>
                               8 ^ this->crc_tab16
                                   [(uint)(StartingAddress >> 8) ^
                                    (ushort)(this->crc_tab16
                                             [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xef] >> 8 ^
                                            this->crc_tab16
                                            [(ushort)(StartingAddress ^
                                                      this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                     this->crc_tab16
                                                     [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xef
                                                     ]) & 0xff]) & 0xff]) & 0xff]) & 0xff] >> 8 ^
            this->crc_tab16
            [(byte)((byte)(this->crc_tab16
                           [(ushort)(Quantity ^
                                     this->crc_tab16
                                     [(ushort)(StartingAddress ^
                                               this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                              this->crc_tab16
                                              [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xef]) &
                                      0xff] >> 8 ^
                                    this->crc_tab16
                                    [(uint)(StartingAddress >> 8) ^
                                     (ushort)(this->crc_tab16
                                              [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xef] >> 8
                                             ^ this->crc_tab16
                                               [(ushort)(StartingAddress ^
                                                         this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                        this->crc_tab16
                                                        [this->crc_tab16[(byte)~DeviceID] & 0xff ^
                                                         0xef]) & 0xff]) & 0xff]) & 0xff] >> 8) ^
                    (byte)this->crc_tab16
                          [(uint)(Quantity >> 8) ^
                           (ushort)(this->crc_tab16
                                    [(uint)(StartingAddress >> 8) ^
                                     (ushort)(this->crc_tab16
                                              [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xef] >> 8
                                             ^ this->crc_tab16
                                               [(ushort)(StartingAddress ^
                                                         this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                        this->crc_tab16
                                                        [this->crc_tab16[(byte)~DeviceID] & 0xff ^
                                                         0xef]) & 0xff]) & 0xff] >> 8 ^
                                   this->crc_tab16
                                   [(ushort)(Quantity ^
                                             this->crc_tab16
                                             [(ushort)(StartingAddress ^
                                                       this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                      this->crc_tab16
                                                      [this->crc_tab16[(byte)~DeviceID] & 0xff ^
                                                       0xef]) & 0xff] >> 8 ^
                                            this->crc_tab16
                                            [(uint)(StartingAddress >> 8) ^
                                             (ushort)(this->crc_tab16
                                                      [this->crc_tab16[(byte)~DeviceID] & 0xff ^
                                                       0xef] >> 8 ^
                                                     this->crc_tab16
                                                     [(ushort)(StartingAddress ^
                                                               this->crc_tab16[(byte)~DeviceID] >> 8
                                                              ^ this->crc_tab16
                                                                [this->crc_tab16[(byte)~DeviceID] &
                                                                 0xff ^ 0xef]) & 0xff]) & 0xff]) &
                                    0xff]) & 0xff] ^ ByteCount)];
    if (1 < ByteCount) {
      uVar4 = 0;
      do {
        uVar3 = this->crc_tab16[(uVar3 ^ Values[uVar4]) & 0xff] >> 8 ^
                this->crc_tab16
                [(ushort)((uVar3 ^ Values[uVar4]) >> 8 ^
                         this->crc_tab16[(uVar3 ^ Values[uVar4]) & 0xff]) & 0xff];
        uVar4 = uVar4 + 1;
      } while (ByteCount >> 1 != uVar4);
    }
    CreateModbusByte(this,(ulong)uVar3 & 0xff);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    value = (U64)(uVar3 >> 8);
  }
  else {
    sVar7 = DeviceID + StartingAddress + (StartingAddress >> 8) + (Quantity >> 8) + Quantity +
            (ushort)ByteCount + 0x10;
    cVar1 = (char)sVar7;
    if (1 < ByteCount) {
      uVar4 = 0;
      do {
        sVar7 = (Values[uVar4] >> 8) + sVar7 + Values[uVar4];
        cVar1 = (char)sVar7;
        uVar4 = uVar4 + 1;
      } while (ByteCount >> 1 != uVar4);
    }
    CreateModbusByte(this,0x3a);
    this_00 = (ModbusSimulationDataGenerator *)&this->mModbusSimulationData;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    uVar5 = (uint)this_00;
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,DeviceID >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,DeviceID & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0x31);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0x30);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)(StartingAddress >> 0xc));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)((StartingAddress & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)StartingAddress >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)(StartingAddress & 0xf0f));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)(Quantity >> 0xc));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)((Quantity & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)Quantity >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)(Quantity & 0xf0f));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,ByteCount >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,ByteCount & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    if (1 < ByteCount) {
      uVar4 = 0;
      do {
        bVar2 = BinToLATIN1(pMVar6,(byte)(Values[uVar4] >> 0xc));
        CreateModbusByte(this,(ulong)bVar2);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar6 = this_00;
        SimulationChannelDescriptor::Advance(uVar5);
        bVar2 = BinToLATIN1(pMVar6,*(byte *)((long)Values + uVar4 * 2 + 1) & 0xf);
        CreateModbusByte(this,(ulong)bVar2);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar6 = this_00;
        SimulationChannelDescriptor::Advance(uVar5);
        bVar2 = BinToLATIN1(pMVar6,(byte)Values[uVar4] >> 4);
        CreateModbusByte(this,(ulong)bVar2);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar6 = this_00;
        SimulationChannelDescriptor::Advance(uVar5);
        bVar2 = BinToLATIN1(pMVar6,(byte)Values[uVar4] & 0xf);
        CreateModbusByte(this,(ulong)bVar2);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar6 = this_00;
        SimulationChannelDescriptor::Advance(uVar5);
        uVar4 = uVar4 + 1;
      } while (ByteCount >> 1 != uVar4);
    }
    bVar2 = BinToLATIN1(pMVar6,(byte)-cVar1 >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(this_00,-cVar1 & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    value = 10;
  }
  CreateModbusByte(this,value);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance((int)this + 0x30);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendWriteMultipleRegistersRequest( U8 DeviceID, U16 StartingAddress, U16 Quantity, U8 ByteCount,
                                                                       U16 Values[] )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUClient )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( 0x10 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( StartingAddress & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( StartingAddress & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( Quantity & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( Quantity & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ByteCount );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        for( int i = 0; i < ByteCount / 2; i++ )
        {
            CreateModbusByte( Values[ i ] & 0x00FF );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

            CreateModbusByte( ( Values[ i ] & 0xFF00 ) >> 8 );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
        }

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, 0x10 );
        CRCValue = update_CRC( CRCValue, StartingAddress & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( StartingAddress & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, Quantity & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( Quantity & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, ByteCount );

        for( int i = 0; i < ByteCount / 2; i++ )
        {
            CRCValue = update_CRC( CRCValue, Values[ i ] & 0x00FF );
            CRCValue = update_CRC( CRCValue, ( Values[ i ] & 0xFF00 ) >> 8 );
        }

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + 0x10;
        LRCvalue = LRCvalue + ( StartingAddress & 0x00FF );
        LRCvalue = LRCvalue + ( ( StartingAddress & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + ( Quantity & 0x00FF );
        LRCvalue = LRCvalue + ( ( Quantity & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + ByteCount;

        for( int i = 0; i < ByteCount / 2; i++ )
        {
            LRCvalue = LRCvalue + ( Values[ i ] & 0x00FF );
            LRCvalue = LRCvalue + ( ( Values[ i ] & 0xFF00 ) >> 8 );
        }

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '1' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '0' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( StartingAddress & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( StartingAddress & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( StartingAddress & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( StartingAddress & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( Quantity & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( Quantity & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( Quantity & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( Quantity & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( ByteCount & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ByteCount & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        for( int i = 0; i < ByteCount / 2; i++ )
        {
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0xF000 ) >> 12 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0x0F00 ) >> 8 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0xF0 ) >> 4 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( Values[ i ] & 0xF ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        }

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}